

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::anon_unknown_0::VertexAttributeStrideCase::test
          (VertexAttributeStrideCase *this)

{
  CallLogWrapper *this_00;
  GLenum reference;
  long lVar1;
  GLenum aGStack_1a0 [2];
  StridePointerData pointers [15];
  GLfloat vertexData [4];
  
  pointers[0].size = 1;
  pointers[0].type = 0x1406;
  pointers[0].stride = 0;
  pointers[0].pointer = vertexData;
  pointers[1].size = 1;
  pointers[1].type = 0x1406;
  pointers[1].stride = 1;
  pointers[1].pointer = vertexData;
  pointers[2].size = 1;
  pointers[2].type = 0x1406;
  pointers[2].stride = 4;
  pointers[2].pointer = vertexData;
  pointers[3].size = 1;
  pointers[3].type = 0x1402;
  pointers[3].stride = 0;
  pointers[3].pointer = vertexData;
  pointers[4].size = 1;
  pointers[4].type = 0x1402;
  pointers[4].stride = 1;
  pointers[4].pointer = vertexData;
  pointers[5].size = 1;
  pointers[5].type = 0x1402;
  pointers[5].stride = 4;
  pointers[5].pointer = vertexData;
  pointers[6].size = 1;
  pointers[6].type = 0x140c;
  pointers[6].stride = 0;
  pointers[6].pointer = vertexData;
  pointers[7].size = 1;
  pointers[7].type = 0x140c;
  pointers[7].stride = 1;
  pointers[7].pointer = vertexData;
  pointers[8].size = 1;
  pointers[8].type = 0x140c;
  pointers[8].stride = 4;
  pointers[8].pointer = vertexData;
  pointers[9].size = 1;
  pointers[9].type = 0x1400;
  pointers[9].stride = 0;
  vertexData[0] = 0.0;
  vertexData[1] = 0.0;
  vertexData[2] = 0.0;
  vertexData[3] = 0.0;
  pointers[9].pointer = vertexData;
  pointers[10].size = 1;
  pointers[10].type = 0x1403;
  pointers[10].stride = 1;
  pointers[10].pointer = vertexData;
  pointers[0xb].size = 1;
  pointers[0xb].type = 0x1403;
  pointers[0xb].stride = 4;
  pointers[0xb].pointer = vertexData;
  pointers[0xc].size = 4;
  pointers[0xc].type = 0x1401;
  pointers[0xc].stride = 0;
  pointers[0xc].pointer = vertexData;
  pointers[0xd].size = 4;
  pointers[0xd].type = 0x1401;
  pointers[0xd].stride = 1;
  pointers[0xd].pointer = vertexData;
  pointers[0xe].size = 4;
  pointers[0xe].type = 0x1401;
  pointers[0xe].stride = 4;
  pointers[0xe].pointer = vertexData;
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  for (lVar1 = 0x10; lVar1 != 0x178; lVar1 = lVar1 + 0x18) {
    reference = 0;
    glu::CallLogWrapper::glVertexAttribPointer
              (this_00,0,*(GLint *)((long)pointers + lVar1 + -0x10),
               *(GLenum *)((long)pointers + lVar1 + -0xc),'\0',
               *(GLsizei *)((long)aGStack_1a0 + lVar1),*(void **)((long)&pointers[0].size + lVar1));
    ApiCase::expectError(&this->super_ApiCase,0);
    verifyVertexAttrib((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                       this_00,0x8624,*(GLenum *)((long)aGStack_1a0 + lVar1),reference);
  }
  return;
}

Assistant:

void test (void)
	{
		GLfloat vertexData[4] = {0.0f}; // never accessed

		struct StridePointerData
		{
			GLint		size;
			GLenum		type;
			GLint		stride;
			void*		pointer;
		};

		// test VertexAttribPointer
		{
			const StridePointerData pointers[] =
			{
				{ 1, GL_FLOAT,				0,	vertexData },
				{ 1, GL_FLOAT,				1,	vertexData },
				{ 1, GL_FLOAT,				4,	vertexData },
				{ 1, GL_SHORT,				0,	vertexData },
				{ 1, GL_SHORT,				1,	vertexData },
				{ 1, GL_SHORT,				4,	vertexData },
				{ 1, GL_FIXED,				0,	vertexData },
				{ 1, GL_FIXED,				1,	vertexData },
				{ 1, GL_FIXED,				4,	vertexData },
				{ 1, GL_BYTE,				0,	vertexData },
				{ 1, GL_UNSIGNED_SHORT,		1,	vertexData },
				{ 1, GL_UNSIGNED_SHORT,		4,	vertexData },
				{ 4, GL_UNSIGNED_BYTE,		0,	vertexData },
				{ 4, GL_UNSIGNED_BYTE,		1,	vertexData },
				{ 4, GL_UNSIGNED_BYTE,		4,	vertexData },
			};

			for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(pointers); ++ndx)
			{
				glVertexAttribPointer(0, pointers[ndx].size, pointers[ndx].type, GL_FALSE, pointers[ndx].stride, pointers[ndx].pointer);
				expectError(GL_NO_ERROR);

				verifyVertexAttrib(m_testCtx, *this, 0, GL_VERTEX_ATTRIB_ARRAY_STRIDE, pointers[ndx].stride);
			}
		}
	}